

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O2

int16_t object_weight_one(object *obj)

{
  uint uVar1;
  int16_t weight;
  ushort uVar2;
  angband_constants *paVar4;
  ulong uVar5;
  uint uVar3;
  
  uVar1._0_2_ = obj->weight;
  uVar1._2_1_ = obj->dd;
  uVar1._3_1_ = obj->ds;
  uVar3 = 0;
  if (0 < (short)(undefined2)uVar1) {
    uVar3 = uVar1;
  }
  weight = (int16_t)uVar3;
  if (obj->curses != (curse_data *)0x0) {
    paVar4 = z_info;
    for (uVar5 = 1; weight = (int16_t)uVar3, uVar5 < paVar4->curse_max; uVar5 = uVar5 + 1) {
      if (obj->curses[uVar5].power != L'\0') {
        uVar2 = modify_weight_for_curse((wchar_t)uVar5,weight);
        uVar3 = (uint)uVar2;
        paVar4 = z_info;
      }
    }
  }
  return weight;
}

Assistant:

int16_t object_weight_one(const struct object *obj)
{
	int16_t result = MAX(obj->weight, 0);

	if (obj->curses) {
		int i;

		for (i = 1; i < z_info->curse_max; ++i) {
			if (obj->curses[i].power) {
				result = modify_weight_for_curse(i, result);
			}
		}
	}

	return result;
}